

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subvq.c
# Opt level: O1

void subvq_subvec_eval_logs3(subvq_t *vq,float32 *feat,int32 s,logmath_t *logmath)

{
  vector_gautbl_t *pvVar1;
  int32 *piVar2;
  float32 *pfVar3;
  long lVar4;
  long lVar5;
  
  pvVar1 = vq->gautbl;
  lVar4 = (long)pvVar1[s].veclen;
  if (0 < lVar4) {
    piVar2 = vq->featdim[s];
    pfVar3 = vq->subvec;
    lVar5 = 0;
    do {
      pfVar3[lVar5] = feat[piVar2[lVar5]];
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  vector_gautbl_eval_logs3(pvVar1 + s,0,vq->vqsize,vq->subvec,vq->vqdist[s],logmath);
  return;
}

Assistant:

void
subvq_subvec_eval_logs3(subvq_t * vq, float32 * feat, int32 s, logmath_t * logmath)
{
    int32 i;
    int32 *featdim;

    /* Extract subvector from feat */
    featdim = vq->featdim[s];
    for (i = 0; i < vq->gautbl[s].veclen; i++)
        vq->subvec[i] = feat[featdim[i]];

    /* Evaluate distances between extracted subvector and corresponding codebook */
    vector_gautbl_eval_logs3(&(vq->gautbl[s]), 0, vq->vqsize, vq->subvec,
                             vq->vqdist[s], logmath);
}